

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O0

void __thiscall xLearn::DMATRIX_TEST_Reset_Test::TestBody(DMATRIX_TEST_Reset_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  DMatrix matrix;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  bool *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  char *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined1 local_1aa;
  undefined1 local_1a9;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  undefined1 local_182;
  undefined1 local_181;
  AssertionResult local_180;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_15a;
  undefined1 local_159;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  undefined4 local_134;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  AssertHelper local_f8;
  Message local_f0;
  undefined4 local_e4;
  AssertionResult local_e0;
  AssertHelper local_d0;
  Message local_c8;
  undefined4 local_bc;
  AssertionResult local_b8;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_91;
  AssertionResult local_90 [9];
  
  DMatrix::DMatrix((DMatrix *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  DMatrix::Reset((DMatrix *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  local_91 = 1;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffdd8,
             (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             in_stack_fffffffffffffdc8,
             (bool *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x150608);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x2d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message((Message *)0x150665);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1506ba);
  local_bc = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffdd8,
             (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             (unsigned_long *)in_stack_fffffffffffffdc8,
             (int *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x15075b);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message((Message *)0x1507b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15080d);
  local_e4 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffdd8,
             (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             (unsigned_long *)in_stack_fffffffffffffdc8,
             (int *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1508ae);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x2f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message((Message *)0x15090b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x150960);
  local_10c = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffdd8,
             (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             (uint *)in_stack_fffffffffffffdc8,
             (int *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x150a01);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message((Message *)0x150a5e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x150ab3);
  local_134 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffdd8,
             (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             (uint *)in_stack_fffffffffffffdc8,
             (int *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x150b54);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x31,pcVar3);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message((Message *)0x150bb1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x150c06);
  local_159 = std::vector<float,_std::allocator<float>_>::empty
                        ((vector<float,_std::allocator<float>_> *)
                         CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
  local_15a = 1;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffdd8,
             (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             in_stack_fffffffffffffdc8,
             (bool *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    in_stack_fffffffffffffdd8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x150cb8);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x32,in_stack_fffffffffffffdd8);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message((Message *)0x150d15);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x150d6a);
  local_181 = std::vector<float,_std::allocator<float>_>::empty
                        ((vector<float,_std::allocator<float>_> *)
                         CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
  local_182 = 1;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffdd8,
             (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             in_stack_fffffffffffffdc8,
             (bool *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_180);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_190);
    in_stack_fffffffffffffdc8 =
         (bool *)testing::AssertionResult::failure_message((AssertionResult *)0x150e1c);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x33,in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message((Message *)0x150e79);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x150ece);
  local_1a9 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::empty((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                       *)CONCAT17(uVar2,in_stack_fffffffffffffdd0));
  local_1aa = 1;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffdd8,(char *)CONCAT17(uVar2,in_stack_fffffffffffffdd0),
             in_stack_fffffffffffffdc8,
             (bool *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_1b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x150f80);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::Message::~Message((Message *)0x150fdb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x151030);
  DMatrix::~DMatrix((DMatrix *)CONCAT17(uVar2,in_stack_fffffffffffffdc0));
  return;
}

Assistant:

TEST(DMATRIX_TEST, Reset) {
  DMatrix matrix;
  matrix.Reset();
  EXPECT_EQ(matrix.has_label, true);
  EXPECT_EQ(matrix.hash_value_1, 0);
  EXPECT_EQ(matrix.hash_value_2, 0);
  EXPECT_EQ(matrix.row_length, 0);
  EXPECT_EQ(matrix.pos, 0);
  EXPECT_EQ(matrix.Y.empty(), true);
  EXPECT_EQ(matrix.norm.empty(), true);
  EXPECT_EQ(matrix.row.empty(),true);
}